

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::CutpoolPropagation::recomputeCapacityThreshold(CutpoolPropagation *this,HighsInt cut)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsCutPool *pHVar4;
  pointer ppVar5;
  pointer piVar6;
  pointer pdVar7;
  HighsDomain *pHVar8;
  pointer pdVar9;
  HighsInt i;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  initializer_list<double> __l;
  double local_48;
  double local_40;
  double local_38;
  
  pHVar4 = this->cutpool;
  ppVar5 = (pHVar4->matrix_).ARrange_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (pHVar4->matrix_).ARindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = ppVar5[cut].first;
  iVar3 = *(int *)((long)(ppVar5 + cut) + 4);
  pdVar7 = (pHVar4->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9[cut] = -((this->domain->mipsolver->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
  for (lVar10 = (long)iVar2; lVar10 < iVar3; lVar10 = lVar10 + 1) {
    pHVar8 = this->domain;
    iVar2 = piVar6[lVar10];
    dVar11 = (pHVar8->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2];
    dVar1 = (pHVar8->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) {
      local_38 = ((pHVar8->mipsolver->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      dVar12 = local_38;
      if ((pHVar8->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] == kContinuous) {
        dVar13 = (dVar11 - dVar1) * 0.3;
        dVar12 = local_38 * 1000.0;
        if (local_38 * 1000.0 <= dVar13) {
          dVar12 = dVar13;
        }
      }
      local_40 = ((dVar11 - dVar1) - dVar12) * ABS(pdVar7[lVar10]);
      local_48 = pdVar9[cut];
      __l._M_len = 3;
      __l._M_array = &local_48;
      dVar11 = std::max<double>(__l);
      pdVar9 = (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar9[cut] = dVar11;
    }
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::recomputeCapacityThreshold(HighsInt cut) {
  HighsInt start = cutpool->getMatrix().getRowStart(cut);
  HighsInt end = cutpool->getMatrix().getRowEnd(cut);
  const HighsInt* arindex = cutpool->getMatrix().getARindex();
  const double* arvalue = cutpool->getMatrix().getARvalue();
  capacityThreshold_[cut] = -domain->feastol();
  for (HighsInt i = start; i < end; ++i) {
    if (domain->col_upper_[arindex[i]] == domain->col_lower_[arindex[i]])
      continue;

    double threshold =
        std::fabs(arvalue[i]) * boundRange(domain->col_upper_[arindex[i]],
                                           domain->col_lower_[arindex[i]],
                                           domain->feastol(),
                                           domain->variableType(arindex[i]));

    capacityThreshold_[cut] =
        std::max({capacityThreshold_[cut], threshold, domain->feastol()});
  }
}